

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sup.c
# Opt level: O0

void supaddsym(toktdef *tab,char *txt,int styp,int sval,int casefold)

{
  code *pcVar1;
  char *pcVar2;
  uint uVar3;
  size_t sVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  char *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  char buf [40];
  char *in_stack_ffffffffffffff90;
  char local_48 [48];
  undefined4 local_18;
  undefined4 local_14;
  char *local_10;
  undefined8 *local_8;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_R8D != 0) {
    strcpy(local_48,in_RSI);
    os_strlwr(in_stack_ffffffffffffff90);
    local_10 = local_48;
  }
  pcVar2 = local_10;
  pcVar1 = (code *)*local_8;
  sVar4 = strlen(local_10);
  uVar3 = tokhsh(local_10);
  (*pcVar1)(local_8,pcVar2,sVar4 & 0xffffffff,local_14,local_18,uVar3);
  return;
}

Assistant:

static void supaddsym(toktdef *tab, char *txt, int styp, int sval,
                      int casefold)
{
    char buf[40];

    if (casefold)
    {
        strcpy(buf, txt);
        os_strlwr(buf);
        txt = buf;
    }
    (*tab->toktfadd)(tab, txt, (int)strlen(txt), styp, sval, tokhsh(txt));
}